

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_354e9::CLIncludeParser::~CLIncludeParser(CLIncludeParser *this)

{
  CLIncludeParser *this_local;
  
  ~CLIncludeParser(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

CLIncludeParser(cm::string_view includePrefix, cmsys::ofstream& depFile,
                  std::ostream& output)
    : IncludePrefix(includePrefix)
    , DepFile(depFile)
    , Output(output)
  {
  }